

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_mem.c
# Opt level: O2

amqp_pool_t * amqp_get_or_create_channel_pool(amqp_connection_state_t state,amqp_channel_t channel)

{
  amqp_pool_table_entry_t *paVar1;
  amqp_pool_table_entry_t_ *paVar2;
  amqp_pool_table_entry_t *paVar3;
  
  paVar1 = (amqp_pool_table_entry_t *)(state->pool_table + (channel & 0xf));
  paVar3 = paVar1;
  do {
    paVar3 = paVar3->next;
    if (paVar3 == (amqp_pool_table_entry_t *)0x0) {
      paVar2 = (amqp_pool_table_entry_t_ *)malloc(0x50);
      if (paVar2 != (amqp_pool_table_entry_t_ *)0x0) {
        paVar2->channel = channel;
        paVar2->next = paVar1->next;
        paVar1->next = paVar2;
        init_amqp_pool(&paVar2->pool,(long)state->frame_max);
        return &paVar2->pool;
      }
      return (amqp_pool_t *)0x0;
    }
  } while (paVar3->channel != channel);
  return &paVar3->pool;
}

Assistant:

amqp_pool_t *amqp_get_or_create_channel_pool(amqp_connection_state_t state,
                                             amqp_channel_t channel) {
  amqp_pool_table_entry_t *entry;
  size_t index = channel % POOL_TABLE_SIZE;

  entry = state->pool_table[index];

  for (; NULL != entry; entry = entry->next) {
    if (channel == entry->channel) {
      return &entry->pool;
    }
  }

  entry = malloc(sizeof(amqp_pool_table_entry_t));
  if (NULL == entry) {
    return NULL;
  }

  entry->channel = channel;
  entry->next = state->pool_table[index];
  state->pool_table[index] = entry;

  init_amqp_pool(&entry->pool, state->frame_max);

  return &entry->pool;
}